

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::StartSection(XmlReporter *this,string *sectionName,string *description)

{
  XmlWriter *name;
  string *in_stack_ffffffffffffff28;
  XmlWriter *in_stack_ffffffffffffff30;
  allocator *attribute;
  string *in_stack_ffffffffffffff38;
  XmlWriter *this_00;
  allocator local_99;
  string local_98 [39];
  undefined1 local_71 [57];
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Section",(allocator *)(local_71 + 0x38));
  XmlWriter::startElement(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  this_00 = (XmlWriter *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_71 + 1),"name",(allocator *)this_00);
  name = XmlWriter::writeAttribute
                   (this_00,in_stack_ffffffffffffff38,(string *)in_stack_ffffffffffffff30);
  attribute = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"description",attribute);
  XmlWriter::writeAttribute(this_00,(string *)name,(string *)attribute);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)(local_71 + 0x38));
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& description ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name", sectionName )
                .writeAttribute( "description", description );
        }